

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O0

void __thiscall
cmTargetIncludeDirectoriesCommand::HandleInterfaceContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  char *value;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string joined;
  bool system_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  cmTargetIncludeDirectoriesCommand *this_local;
  
  joined.field_2._M_local_buf[0xe] = system;
  joined.field_2._M_local_buf[0xf] = prepend;
  cmTargetPropCommandBase::HandleInterfaceContent
            (&this->super_cmTargetPropCommandBase,tgt,content,prepend,system);
  if ((joined.field_2._M_local_buf[0xe] & 1U) != 0) {
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_48,content,";");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_69);
    value = (char *)std::__cxx11::string::c_str();
    cmTarget::AppendProperty(tgt,&local_68,value,false);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmTargetIncludeDirectoriesCommand
::HandleInterfaceContent(cmTarget *tgt,
                         const std::vector<std::string> &content,
                         bool prepend, bool system)
{
  cmTargetPropCommandBase::HandleInterfaceContent(tgt, content,
                                                  prepend, system);

  if (system)
    {
    std::string joined = cmJoin(content, ";");
    tgt->AppendProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                        joined.c_str());
    }
}